

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_get_format(coda_cursor *cursor,coda_format *format)

{
  coda_dynamic_type_struct *pcVar1;
  coda_backend cVar2;
  undefined8 uVar3;
  char *message;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar1 = cursor->stack[cursor->n - 1].type, pcVar1 == (coda_dynamic_type_struct *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar3 = 0x780;
  }
  else {
    if (format != (coda_format *)0x0) {
      cVar2 = pcVar1->backend;
      if (99 < cVar2) {
        cVar2 = pcVar1->definition->format;
      }
      *format = cVar2;
      return 0;
    }
    message = "format argument is NULL (%s:%u)";
    uVar3 = 0x785;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar3);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_format(const coda_cursor *cursor, coda_format *format)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (format == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "format argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    *format = type->format;

    return 0;
}